

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O0

int __thiscall jrtplib::RTCPCompoundPacketBuilder::EndBuild(RTCPCompoundPacketBuilder *this)

{
  size_t sVar1;
  size_t sVar2;
  RTCPPacket *pRVar3;
  bool bVar4;
  uint16_t uVar5;
  uint32_t uVar6;
  size_t sVar7;
  size_t sVar8;
  RTPMemoryManager *pRVar9;
  void *pvVar10;
  RTCPSDESPacket *pRVar11;
  uint32_t *puVar12;
  reference ppSVar13;
  reference pBVar14;
  uint8_t *puVar15;
  iterator local_1b8;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer> local_1b0;
  iterator local_1a8;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer> local_1a0;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer> local_198;
  const_iterator it_2;
  iterator local_188;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer> local_180;
  iterator local_178;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer> local_170;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer> local_168;
  const_iterator it_1;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*> local_158;
  ulong local_150;
  size_t numwords_1;
  ulong local_140;
  size_t i;
  size_t num;
  size_t r;
  iterator local_120;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer> local_118;
  iterator local_110;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer> local_108;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer> local_100;
  const_iterator itemend;
  const_iterator itemit;
  uint32_t *ssrc;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*> local_e0;
  byte local_d1;
  ulong uStack_d0;
  uint8_t sourcecount;
  size_t offset_1;
  RTCPCommonHeader *hdr_1;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*> local_b8;
  const_iterator sourceit;
  iterator iStack_a8;
  bool done_1;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer> local_a0 [3];
  ulong local_88;
  size_t numwords;
  iterator local_78;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer> local_70;
  byte local_61;
  ulong uStack_60;
  uint8_t count;
  size_t offset;
  RTCPCommonHeader *hdr;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer> local_48;
  const_iterator it;
  bool done;
  RTCPSDESPacket *pRStack_38;
  bool firstpacket;
  RTCPPacket *p;
  uint8_t *curbuf;
  size_t len;
  uint8_t *buf;
  RTCPCompoundPacketBuilder *this_local;
  
  if ((this->arebuilding & 1U) == 0) {
    this_local._4_4_ = -0x2a;
  }
  else if ((this->report).headerlength == 0) {
    this_local._4_4_ = -0x29;
  }
  else {
    sVar1 = this->appsize;
    sVar2 = this->byesize;
    buf = (uint8_t *)this;
    sVar7 = Report::NeededBytes(&this->report);
    sVar8 = SDES::NeededBytes(&this->sdes);
    puVar15 = (uint8_t *)(sVar1 + sVar2 + sVar7 + sVar8);
    curbuf = puVar15;
    if ((this->external & 1U) == 0) {
      pRVar9 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
      len = (size_t)operator_new__((size_t)puVar15,pRVar9,6);
      if ((void *)len == (void *)0x0) {
        return -1;
      }
    }
    else {
      len = (size_t)this->buffer;
    }
    p = (RTCPPacket *)len;
    it._M_node._7_1_ = 1;
    it._M_node._6_1_ = 0;
    hdr = (RTCPCommonHeader *)
          std::__cxx11::
          list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
          ::begin(&(this->report).reportblocks);
    std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::_List_const_iterator
              (&local_48,(iterator *)&hdr);
    do {
      offset = (size_t)p;
      *(byte *)&p->_vptr_RTCPPacket = *(byte *)&p->_vptr_RTCPPacket & 0x3f | 0x80;
      *(byte *)&p->_vptr_RTCPPacket = *(byte *)&p->_vptr_RTCPPacket & 0xdf;
      if (((it._M_node._7_1_ & 1) == 0) || (((this->report).isSR & 1U) == 0)) {
        *(undefined1 *)((long)&p->_vptr_RTCPPacket + 1) = 0xc9;
        *(undefined4 *)((long)&p->_vptr_RTCPPacket + 4) = *(undefined4 *)(this->report).headerdata;
        uStack_60 = 8;
      }
      else {
        *(undefined1 *)((long)&p->_vptr_RTCPPacket + 1) = 200;
        memcpy((void *)((long)&p->_vptr_RTCPPacket + 4),(this->report).headerdata,
               (this->report).headerlength);
        uStack_60 = (this->report).headerlength + 4;
      }
      it._M_node._7_1_ = 0;
      local_61 = 0;
      while( true ) {
        local_78._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
             ::end(&(this->report).reportblocks);
        std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::_List_const_iterator
                  (&local_70,&local_78);
        bVar4 = std::operator!=(&local_48,&local_70);
        if (!bVar4 || 0x1e < local_61) break;
        pvVar10 = (void *)((long)&p->_vptr_RTCPPacket + uStack_60);
        pBVar14 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::operator*
                            (&local_48);
        puVar15 = pBVar14->packetdata;
        pBVar14 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::operator*
                            (&local_48);
        memcpy(pvVar10,puVar15,pBVar14->packetlength);
        pBVar14 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::operator*
                            (&local_48);
        uStack_60 = pBVar14->packetlength + uStack_60;
        local_61 = local_61 + 1;
        numwords = (size_t)std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::
                           operator++(&local_48,0);
      }
      local_88 = uStack_60 >> 2;
      uVar5 = htons((short)local_88 - 1);
      *(uint16_t *)(offset + 2) = uVar5;
      *(byte *)offset = *(byte *)offset & 0xe0 | local_61 & 0x1f;
      if (*(char *)(offset + 1) == -0x38) {
        pRVar9 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
        pRVar11 = (RTCPSDESPacket *)operator_new(0x20,pRVar9,0x15);
        RTCPSRPacket::RTCPSRPacket((RTCPSRPacket *)pRVar11,(uint8_t *)p,uStack_60);
        pRStack_38 = pRVar11;
      }
      else {
        pRVar9 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
        pRVar11 = (RTCPSDESPacket *)operator_new(0x20,pRVar9,0x13);
        RTCPRRPacket::RTCPRRPacket((RTCPRRPacket *)pRVar11,(uint8_t *)p,uStack_60);
        pRStack_38 = pRVar11;
      }
      sVar1 = len;
      if (pRStack_38 == (RTCPSDESPacket *)0x0) {
        if ((this->external & 1U) == 0) {
          pRVar9 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
          RTPDeleteByteArray((uint8_t *)sVar1,pRVar9);
        }
        RTCPCompoundPacket::ClearPacketList(&this->super_RTCPCompoundPacket);
        return -1;
      }
      std::__cxx11::list<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>::push_back
                (&(this->super_RTCPCompoundPacket).rtcppacklist,
                 (value_type *)&stack0xffffffffffffffc8);
      p = (RTCPPacket *)((long)&p->_vptr_RTCPPacket + uStack_60);
      iStack_a8 = std::__cxx11::
                  list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
                  ::end(&(this->report).reportblocks);
      std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::_List_const_iterator
                (local_a0,&stack0xffffffffffffff58);
      bVar4 = std::operator==(&local_48,local_a0);
      if (bVar4) {
        it._M_node._6_1_ = 1;
      }
    } while (((it._M_node._6_1_ ^ 0xff) & 1) != 0);
    bVar4 = std::__cxx11::
            list<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
            ::empty(&(this->sdes).sdessources);
    if (!bVar4) {
      sourceit._M_node._7_1_ = 0;
      hdr_1 = (RTCPCommonHeader *)
              std::__cxx11::
              list<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
              ::begin(&(this->sdes).sdessources);
      std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>::
      _List_const_iterator(&local_b8,(iterator *)&hdr_1);
      do {
        offset_1 = (size_t)p;
        uStack_d0 = 4;
        *(byte *)&p->_vptr_RTCPPacket = *(byte *)&p->_vptr_RTCPPacket & 0x3f | 0x80;
        *(byte *)&p->_vptr_RTCPPacket = *(byte *)&p->_vptr_RTCPPacket & 0xdf;
        *(undefined1 *)((long)&p->_vptr_RTCPPacket + 1) = 0xca;
        local_d1 = 0;
        while( true ) {
          ssrc = (uint32_t *)
                 std::__cxx11::
                 list<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
                 ::end(&(this->sdes).sdessources);
          std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>::
          _List_const_iterator(&local_e0,(iterator *)&ssrc);
          bVar4 = std::operator!=(&local_b8,&local_e0);
          if (!bVar4 || 0x1e < local_d1) break;
          puVar12 = (uint32_t *)((long)&p->_vptr_RTCPPacket + uStack_d0);
          ppSVar13 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>::
                     operator*(&local_b8);
          uVar6 = htonl((*ppSVar13)->ssrc);
          *puVar12 = uVar6;
          uStack_d0 = uStack_d0 + 4;
          std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::
          _List_const_iterator(&itemend);
          std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::
          _List_const_iterator(&local_100);
          ppSVar13 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>::
                     operator*(&local_b8);
          local_110._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
               ::begin(&(*ppSVar13)->items);
          std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::
          _List_const_iterator(&local_108,&local_110);
          itemend._M_node = local_108._M_node;
          ppSVar13 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>::
                     operator*(&local_b8);
          local_120._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
               ::end(&(*ppSVar13)->items);
          std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::
          _List_const_iterator(&local_118,&local_120);
          local_100._M_node = local_118._M_node;
          while (bVar4 = std::operator!=(&itemend,&local_100), bVar4) {
            pvVar10 = (void *)((long)&p->_vptr_RTCPPacket + uStack_d0);
            pBVar14 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::
                      operator*(&itemend);
            puVar15 = pBVar14->packetdata;
            pBVar14 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::
                      operator*(&itemend);
            memcpy(pvVar10,puVar15,pBVar14->packetlength);
            pBVar14 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::
                      operator*(&itemend);
            uStack_d0 = pBVar14->packetlength + uStack_d0;
            r = (size_t)std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::
                        operator++(&itemend,0);
          }
          *(undefined1 *)((long)&p->_vptr_RTCPPacket + uStack_d0) = 0;
          uStack_d0 = uStack_d0 + 1;
          num = uStack_d0 & 3;
          if (num != 0) {
            i = 4 - num;
            for (local_140 = 0; local_140 < i; local_140 = local_140 + 1) {
              *(undefined1 *)((long)&p->_vptr_RTCPPacket + uStack_d0 + local_140) = 0;
            }
            uStack_d0 = i + uStack_d0;
          }
          numwords_1 = (size_t)std::
                               _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>
                               ::operator++(&local_b8,0);
          local_d1 = local_d1 + 1;
        }
        local_150 = uStack_d0 >> 2;
        *(byte *)offset_1 = *(byte *)offset_1 & 0xe0 | local_d1 & 0x1f;
        uVar5 = htons((short)local_150 - 1);
        *(uint16_t *)(offset_1 + 2) = uVar5;
        pRVar9 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
        pRVar11 = (RTCPSDESPacket *)operator_new(0x38,pRVar9,0x14);
        RTCPSDESPacket::RTCPSDESPacket(pRVar11,(uint8_t *)p,uStack_d0);
        sVar1 = len;
        pRStack_38 = pRVar11;
        if (pRVar11 == (RTCPSDESPacket *)0x0) {
          if ((this->external & 1U) == 0) {
            pRVar9 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
            RTPDeleteByteArray((uint8_t *)sVar1,pRVar9);
          }
          RTCPCompoundPacket::ClearPacketList(&this->super_RTCPCompoundPacket);
          return -1;
        }
        std::__cxx11::list<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>::push_back
                  (&(this->super_RTCPCompoundPacket).rtcppacklist,
                   (value_type *)&stack0xffffffffffffffc8);
        p = (RTCPPacket *)((long)&p->_vptr_RTCPPacket + uStack_d0);
        it_1._M_node = (_List_node_base *)
                       std::__cxx11::
                       list<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
                       ::end(&(this->sdes).sdessources);
        std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>::
        _List_const_iterator(&local_158,(iterator *)&it_1);
        bVar4 = std::operator==(&local_b8,&local_158);
        if (bVar4) {
          sourceit._M_node._7_1_ = 1;
        }
      } while (((sourceit._M_node._7_1_ ^ 0xff) & 1) != 0);
    }
    std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::_List_const_iterator
              (&local_168);
    local_178._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
         ::begin(&this->apppackets);
    std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::_List_const_iterator
              (&local_170,&local_178);
    local_168._M_node = local_170._M_node;
    while( true ) {
      local_188._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
           ::end(&this->apppackets);
      std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::_List_const_iterator
                (&local_180,&local_188);
      bVar4 = std::operator!=(&local_168,&local_180);
      pRVar3 = p;
      if (!bVar4) break;
      pBVar14 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::operator*
                          (&local_168);
      puVar15 = pBVar14->packetdata;
      pBVar14 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::operator*
                          (&local_168);
      memcpy(pRVar3,puVar15,pBVar14->packetlength);
      pRVar9 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
      pRVar11 = (RTCPSDESPacket *)operator_new(0x28,pRVar9,0xf);
      pRVar3 = p;
      pBVar14 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::operator*
                          (&local_168);
      RTCPAPPPacket::RTCPAPPPacket((RTCPAPPPacket *)pRVar11,(uint8_t *)pRVar3,pBVar14->packetlength)
      ;
      sVar1 = len;
      pRStack_38 = pRVar11;
      if (pRVar11 == (RTCPSDESPacket *)0x0) {
        if ((this->external & 1U) == 0) {
          pRVar9 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
          RTPDeleteByteArray((uint8_t *)sVar1,pRVar9);
        }
        RTCPCompoundPacket::ClearPacketList(&this->super_RTCPCompoundPacket);
        return -1;
      }
      std::__cxx11::list<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>::push_back
                (&(this->super_RTCPCompoundPacket).rtcppacklist,
                 (value_type *)&stack0xffffffffffffffc8);
      pBVar14 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::operator*
                          (&local_168);
      p = (RTCPPacket *)((long)&p->_vptr_RTCPPacket + pBVar14->packetlength);
      it_2._M_node = (_List_node_base *)
                     std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::
                     operator++(&local_168,0);
    }
    std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::_List_const_iterator
              (&local_198);
    local_1a8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
         ::begin(&this->byepackets);
    std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::_List_const_iterator
              (&local_1a0,&local_1a8);
    local_198._M_node = local_1a0._M_node;
    while( true ) {
      local_1b8._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
           ::end(&this->byepackets);
      std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::_List_const_iterator
                (&local_1b0,&local_1b8);
      bVar4 = std::operator!=(&local_198,&local_1b0);
      pRVar3 = p;
      if (!bVar4) break;
      pBVar14 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::operator*
                          (&local_198);
      puVar15 = pBVar14->packetdata;
      pBVar14 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::operator*
                          (&local_198);
      memcpy(pRVar3,puVar15,pBVar14->packetlength);
      pRVar9 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
      pRVar11 = (RTCPSDESPacket *)operator_new(0x28,pRVar9,0x10);
      pRVar3 = p;
      pBVar14 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::operator*
                          (&local_198);
      RTCPBYEPacket::RTCPBYEPacket((RTCPBYEPacket *)pRVar11,(uint8_t *)pRVar3,pBVar14->packetlength)
      ;
      sVar1 = len;
      pRStack_38 = pRVar11;
      if (pRVar11 == (RTCPSDESPacket *)0x0) {
        if ((this->external & 1U) == 0) {
          pRVar9 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
          RTPDeleteByteArray((uint8_t *)sVar1,pRVar9);
        }
        RTCPCompoundPacket::ClearPacketList(&this->super_RTCPCompoundPacket);
        return -1;
      }
      std::__cxx11::list<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>::push_back
                (&(this->super_RTCPCompoundPacket).rtcppacklist,
                 (value_type *)&stack0xffffffffffffffc8);
      pBVar14 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::operator*
                          (&local_198);
      p = (RTCPPacket *)((long)&p->_vptr_RTCPPacket + pBVar14->packetlength);
      std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::operator++
                (&local_198,0);
    }
    (this->super_RTCPCompoundPacket).compoundpacket = (uint8_t *)len;
    (this->super_RTCPCompoundPacket).compoundpacketlength = (size_t)curbuf;
    this->arebuilding = false;
    ClearBuildBuffers(this);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int RTCPCompoundPacketBuilder::EndBuild()
{
	if (!arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTBUILDING;
	if (report.headerlength == 0)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOREPORTPRESENT;
	
	uint8_t *buf;
	size_t len;
	
#ifndef RTP_SUPPORT_RTCPUNKNOWN
	len = appsize+byesize+report.NeededBytes()+sdes.NeededBytes();
#else
	len = appsize+unknownsize+byesize+report.NeededBytes()+sdes.NeededBytes();
#endif // RTP_SUPPORT_RTCPUNKNOWN 
	
	if (!external)
	{
		buf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTCPCOMPOUNDPACKET) uint8_t[len];
		if (buf == 0)
			return ERR_RTP_OUTOFMEM;
	}
	else
		buf = buffer;
	
	uint8_t *curbuf = buf;
	RTCPPacket *p;

	// first, we'll add all report info
	
	{
		bool firstpacket = true;
		bool done = false;
		std::list<Buffer>::const_iterator it = report.reportblocks.begin();
		do
		{
			RTCPCommonHeader *hdr = (RTCPCommonHeader *)curbuf;
			size_t offset;
			
			hdr->version = 2;
			hdr->padding = 0;

			if (firstpacket && report.isSR)
			{
				hdr->packettype = RTP_RTCPTYPE_SR;
				memcpy((curbuf+sizeof(RTCPCommonHeader)),report.headerdata,report.headerlength);
				offset = sizeof(RTCPCommonHeader)+report.headerlength;
			}
			else
			{
				hdr->packettype = RTP_RTCPTYPE_RR;
				memcpy((curbuf+sizeof(RTCPCommonHeader)),report.headerdata,sizeof(uint32_t));
				offset = sizeof(RTCPCommonHeader)+sizeof(uint32_t);
			}
			firstpacket = false;
			
			uint8_t count = 0;

			while (it != report.reportblocks.end() && count < 31)
			{
				memcpy(curbuf+offset,(*it).packetdata,(*it).packetlength);
				offset += (*it).packetlength;
				count++;
				it++;
			}

			size_t numwords = offset/sizeof(uint32_t);

			hdr->length = htons((uint16_t)(numwords-1));
			hdr->count = count;

			// add entry in parent's list
			if (hdr->packettype == RTP_RTCPTYPE_SR)
				p = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPSRPACKET) RTCPSRPacket(curbuf,offset);
			else
				p = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPRRPACKET) RTCPRRPacket(curbuf,offset);
			if (p == 0)
			{
				if (!external)
					RTPDeleteByteArray(buf,GetMemoryManager());
				ClearPacketList();
				return ERR_RTP_OUTOFMEM;
			}
			rtcppacklist.push_back(p);

			curbuf += offset;
			if (it == report.reportblocks.end())
				done = true;
		} while (!done);
	}
		
	// then, we'll add the sdes info

	if (!sdes.sdessources.empty())
	{
		bool done = false;
		std::list<SDESSource *>::const_iterator sourceit = sdes.sdessources.begin();
		
		do
		{
			RTCPCommonHeader *hdr = (RTCPCommonHeader *)curbuf;
			size_t offset = sizeof(RTCPCommonHeader);
			
			hdr->version = 2;
			hdr->padding = 0;
			hdr->packettype = RTP_RTCPTYPE_SDES;

			uint8_t sourcecount = 0;
			
			while (sourceit != sdes.sdessources.end() && sourcecount < 31)
			{
				uint32_t *ssrc = (uint32_t *)(curbuf+offset);
				*ssrc = htonl((*sourceit)->ssrc);
				offset += sizeof(uint32_t);
				
				std::list<Buffer>::const_iterator itemit,itemend;

				itemit = (*sourceit)->items.begin();
				itemend = (*sourceit)->items.end();
				while (itemit != itemend)
				{
					memcpy(curbuf+offset,(*itemit).packetdata,(*itemit).packetlength);
					offset += (*itemit).packetlength;
					itemit++;
				}

				curbuf[offset] = 0; // end of item list;
				offset++;

				size_t r = offset&0x03;
				if (r != 0) // align to 32 bit boundary
				{
					size_t num = 4-r;
					size_t i;

					for (i = 0 ; i < num ; i++)
						curbuf[offset+i] = 0;
					offset += num;
				}
				
				sourceit++;
				sourcecount++;
			}

			size_t numwords = offset/4;
			
			hdr->count = sourcecount;
			hdr->length = htons((uint16_t)(numwords-1));

			p = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPSDESPACKET) RTCPSDESPacket(curbuf,offset);
			if (p == 0)
			{
				if (!external)
					RTPDeleteByteArray(buf,GetMemoryManager());
				ClearPacketList();
				return ERR_RTP_OUTOFMEM;
			}
			rtcppacklist.push_back(p);
			
			curbuf += offset;
			if (sourceit == sdes.sdessources.end())
				done = true;
		} while (!done);
	}
	
	// adding the app data
	
	{
		std::list<Buffer>::const_iterator it;

		for (it = apppackets.begin() ; it != apppackets.end() ; it++)
		{
			memcpy(curbuf,(*it).packetdata,(*it).packetlength);
			
			p = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPAPPPACKET) RTCPAPPPacket(curbuf,(*it).packetlength);
			if (p == 0)
			{
				if (!external)
					RTPDeleteByteArray(buf,GetMemoryManager());
				ClearPacketList();
				return ERR_RTP_OUTOFMEM;
			}
			rtcppacklist.push_back(p);
	
			curbuf += (*it).packetlength;
		}
	}

#ifdef RTP_SUPPORT_RTCPUNKNOWN

	// adding the unknown data
	
	{
		std::list<Buffer>::const_iterator it;

		for (it = unknownpackets.begin() ; it != unknownpackets.end() ; it++)
		{
			memcpy(curbuf,(*it).packetdata,(*it).packetlength);
			
			p = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPUNKNOWNPACKET) RTCPUnknownPacket(curbuf,(*it).packetlength);
			if (p == 0)
			{
				if (!external)
					RTPDeleteByteArray(buf,GetMemoryManager());
				ClearPacketList();
				return ERR_RTP_OUTOFMEM;
			}
			rtcppacklist.push_back(p);
	
			curbuf += (*it).packetlength;
		}
	}

#endif // RTP_SUPPORT_RTCPUNKNOWN 

	// adding bye packets
	
	{
		std::list<Buffer>::const_iterator it;

		for (it = byepackets.begin() ; it != byepackets.end() ; it++)
		{
			memcpy(curbuf,(*it).packetdata,(*it).packetlength);
			
			p = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPBYEPACKET) RTCPBYEPacket(curbuf,(*it).packetlength);
			if (p == 0)
			{
				if (!external)
					RTPDeleteByteArray(buf,GetMemoryManager());
				ClearPacketList();
				return ERR_RTP_OUTOFMEM;
			}
			rtcppacklist.push_back(p);
	
			curbuf += (*it).packetlength;
		}
	}
	
	compoundpacket = buf;
	compoundpacketlength = len;
	arebuilding = false;
	ClearBuildBuffers();
	return 0;
}